

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O3

Var Js::JavascriptMath::Not_Full(Var aRight,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint uVar5;
  undefined4 *puVar6;
  RecyclableObject *this;
  Var pvVar7;
  char *message;
  char *error;
  uint lineNumber;
  char *fileName;
  
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00a9a4f1;
    *puVar6 = 0;
LAB_00a9a30b:
    this = UnsafeVarTo<Js::RecyclableObject>(aRight);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00a9a4f1;
      *puVar6 = 0;
    }
    TVar1 = ((this->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_BigInt) {
        pvVar7 = JavascriptBigInt::Not(aRight);
        return pvVar7;
      }
    }
    else {
      BVar4 = RecyclableObject::IsExternal(this);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        fileName = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
        ;
        error = "(typeId < TypeIds_Limit || obj->IsExternal())";
        message = "GetTypeId aValue has invalid TypeId";
        lineNumber = 0xe;
        goto LAB_00a9a3ee;
      }
    }
  }
  else if (((ulong)aRight & 0x1ffff00000000) == 0x1000000000000 ||
           ((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
    if ((ulong)aRight >> 0x32 == 0 && ((ulong)aRight & 0xffff000000000000) != 0x1000000000000)
    goto LAB_00a9a30b;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
LAB_00a9a3ee:
    bVar3 = Throw::ReportAssert(fileName,lineNumber,error,message);
    if (!bVar3) goto LAB_00a9a4f1;
    *puVar6 = 0;
  }
  if (((ulong)aRight & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
      uVar5 = JavascriptConversion::ToInt32_Full(aRight,scriptContext);
      aRight = (Var)(ulong)uVar5;
      goto LAB_00a9a4da;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00a9a4f1;
    *puVar6 = 0;
  }
  if (((ulong)aRight & 0x1ffff00000000) != 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) {
LAB_00a9a4f1:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
LAB_00a9a4da:
  return (Var)((ulong)~(uint)aRight | 0x1000000000000);
}

Assistant:

Var JavascriptMath::Not_Full(Var aRight, ScriptContext* scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_Not_Full);
#if _M_IX86
            AssertMsg(!TaggedInt::Is(aRight), "Should be detected");
#endif
            if (JavascriptOperators::GetTypeId(aRight) == TypeIds_BigInt)
            {
                return JavascriptBigInt::Not(aRight);
            }

            int nValue = JavascriptConversion::ToInt32(aRight, scriptContext);
            return JavascriptNumber::ToVar(~nValue, scriptContext);
            JIT_HELPER_END(Op_Not_Full);
        }